

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCVar2;
  Cluster **ppCVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Cluster **ppCVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  longlong lVar9;
  BlockEntry *pBVar10;
  Cluster **ppCVar11;
  Cluster **ppCVar12;
  Cluster **ppCVar13;
  
  lVar8 = GetFirst(this,pResult);
  if (-1 < lVar8) {
    if (*pResult == (BlockEntry *)0x0) {
      __assert_fail("pResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x12e0,
                    "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
    }
    iVar7 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar7 != 0) {
      pCVar2 = (*pResult)->m_pCluster;
      if (pCVar2 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e6,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      if (pCVar2->m_index < 0) {
        __assert_fail("pCluster->GetIndex() >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e7,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      iVar7 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar9 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar7),pCVar2);
      if (lVar9 < time_ns) {
        ppCVar3 = this->m_pSegment->m_clusters;
        if (ppCVar3 == (Cluster **)0x0) {
          __assert_fail("clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12ed,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar8 = this->m_pSegment->m_clusterCount;
        if (lVar8 < 1) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f0,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar4 = pCVar2->m_index;
        if (ppCVar3[lVar4] != pCVar2) {
          __assert_fail("*i == pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f4,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar9 = Cluster::GetTime(pCVar2);
        if (time_ns < lVar9) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f5,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        ppCVar1 = ppCVar3 + lVar4;
        ppCVar12 = ppCVar3 + lVar8;
        ppCVar13 = ppCVar1;
        while (ppCVar13 < ppCVar12) {
          auVar5._8_8_ = (long)ppCVar12 - (long)ppCVar13 >> 0x3f;
          auVar5._0_8_ = (long)ppCVar12 - (long)ppCVar13 >> 3;
          ppCVar11 = ppCVar13 + SUB168(auVar5 / SEXT816(2),0);
          if (ppCVar12 <= ppCVar11) {
            __assert_fail("mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1303,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pCVar2 = *ppCVar11;
          if (pCVar2 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1306,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index < 0) {
            __assert_fail("pCluster->GetIndex() >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1307,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index != (long)ppCVar11 - (long)this->m_pSegment->m_clusters >> 3) {
            __assert_fail("pCluster->GetIndex() == long(mid - m_pSegment->m_clusters)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1308,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar9 = Cluster::GetTime(pCVar2);
          ppCVar6 = ppCVar11 + 1;
          if (time_ns < lVar9) {
            ppCVar12 = ppCVar11;
            ppCVar6 = ppCVar13;
          }
          ppCVar13 = ppCVar6;
          if (ppCVar12 < ppCVar13) {
            __assert_fail("lo <= hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1311,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
        }
        if (ppCVar13 != ppCVar12) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1314,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (ppCVar13 <= ppCVar1) {
          __assert_fail("lo > i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1315,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (ppCVar3 + lVar8 < ppCVar13) {
          __assert_fail("lo <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1316,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        while (ppCVar1 < ppCVar13) {
          pCVar2 = ppCVar13[-1];
          if (pCVar2 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131a,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar9 = Cluster::GetTime(pCVar2);
          if (time_ns < lVar9) {
            __assert_fail("pCluster->GetTime() <= time_ns",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131b,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          ppCVar13 = ppCVar13 + -1;
          pBVar10 = Cluster::GetEntry(pCVar2,this,-1);
          *pResult = pBVar10;
          if ((pBVar10 != (BlockEntry *)0x0) &&
             (iVar7 = (*pBVar10->_vptr_BlockEntry[3])(pBVar10), iVar7 != 0)) {
            return 0;
          }
        }
        *pResult = &(this->m_eos).super_BlockEntry;
      }
    }
    lVar8 = 0;
  }
  return lVar8;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}